

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
::init<Kernel::Literal*>
          (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
           *this,SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed)

{
  byte bVar1;
  EVP_PKEY_CTX *in_RDX;
  long in_RSI;
  Node *in_RDI;
  undefined4 in_R8D;
  Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *unaff_retaddr;
  Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  InstanceCntr local_45 [4];
  undefined1 in_stack_ffffffffffffffbf;
  Literal *in_stack_ffffffffffffffc0;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this_00;
  anon_class_8_1_8991fb9c bindSpecialVar;
  undefined1 backtrackable;
  Node *n;
  
  bVar1 = (byte)in_R8D;
  n = in_RDI;
  RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::init
            ((RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_> *)in_RDI,in_RDX);
  *(byte *)&in_RDI[0xe]._term._content = bVar1 & 1;
  this_00 = (SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)0x0;
  bindSpecialVar.this =
       (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
        *)0x0;
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>::Option
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_> *)
             0x437ccc);
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>::operator=
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_> *)
             CONCAT44(in_R8D,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>::~Option
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_> *)
             0x437cee);
  *(undefined1 *)
   &((DHMap<Kernel::TermSpec,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
    &in_RDI[0x14]._term)->_timestamp = 0;
  InstanceCntr::InstanceCntr(local_45,(Cntr *)(in_RSI + 0x10));
  backtrackable = (undefined1)((ulong)in_RSI >> 0x38);
  if (in_RDX != (EVP_PKEY_CTX *)0x0) {
    RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::bdRecord
              ((RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_> *)
               CONCAT44(in_R8D,in_stack_ffffffffffffff80),(BacktrackData *)in_stack_ffffffffffffff78
              );
    createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>::init<Kernel::Literal*>(Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node*,Kernel::Literal*,bool,bool)::_lambda(unsigned_int,Kernel::TermList)_1_>
              (this_00,in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf,bindSpecialVar);
    RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::bdDone
              ((RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_> *)0x437d76);
    Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
    ::prepareChildren(unaff_retaddr,n,(bool)backtrackable);
  }
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args) {
        _algo.init(std::move(args)...);
        _retrieveSubstitution = retrieveSubstitution;
        _leafData = {};
        _normalizationRecording = false;
        _iterCntr = InstanceCntr(parent->_iterCnt);

#define DEBUG_QUERY(lvl, ...) if (lvl < 0) DBG(__VA_ARGS__)
        if(!root) {
          return;
        }

        _algo.bdRecord(_queryInitBacktrackData);
        parent->createBindings(query, reversed, 
            [&](unsigned var, TermList t) { _algo.bindQuerySpecialVar(var, t); });
        DEBUG_QUERY(1, "query: ", _algo)
        _algo.bdDone();


        prepareChildren(root, /* backtrackable */ false);
      }